

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O1

ByteData256 *
cfd::CollectSighashByTx
          (ByteData256 *__return_storage_ptr__,Transaction *transaction,OutPoint *outpoint,
          UtxoData *utxo,SigHashType *sighash_type,Pubkey *pubkey,Script *redeem_script,
          WitnessVersion witness_version,ByteData *param_8,TaprootScriptTree *param_9)

{
  char cVar1;
  undefined4 uVar2;
  Script local_b0;
  SigHashType local_74 [12];
  Script local_68;
  
  cfd::core::OutPoint::GetTxid();
  uVar2 = cfd::core::OutPoint::GetVout();
  uVar2 = (**(code **)(*(long *)transaction + 0x10))(transaction,&local_b0,uVar2);
  local_b0._vptr_Script = (_func_int **)&PTR__Txid_002b2f00;
  if (local_b0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  cfd::core::Script::Script(&local_b0,redeem_script);
  cVar1 = cfd::core::Script::IsEmpty();
  if (cVar1 != '\0') {
    cfd::core::ScriptUtil::CreateP2pkhLockingScript((Pubkey *)&local_68);
    cfd::core::Script::operator=(&local_b0,&local_68);
    core::Script::~Script(&local_68);
  }
  cfd::core::Script::GetData();
  cfd::core::SigHashType::SigHashType(local_74,sighash_type);
  cfd::core::Transaction::GetSignatureHash
            (__return_storage_ptr__,transaction,uVar2,&local_68,local_74,&utxo->amount,
             witness_version);
  if (local_68._vptr_Script != (_func_int **)0x0) {
    operator_delete(local_68._vptr_Script);
  }
  core::Script::~Script(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

static ByteData256 CollectSighashByTx(
    const Transaction* transaction, const OutPoint& outpoint,
    const UtxoData& utxo, const SigHashType& sighash_type,
    const Pubkey& pubkey, const Script& redeem_script,
    WitnessVersion witness_version, const ByteData*,
    const TaprootScriptTree*) {
  uint32_t index =
      transaction->GetTxInIndex(outpoint.GetTxid(), outpoint.GetVout());
  Script script_data = redeem_script;
  if (script_data.IsEmpty()) {
    script_data = ScriptUtil::CreateP2pkhLockingScript(pubkey);
  }
  auto sighash = transaction->GetSignatureHash(
      index, script_data.GetData(), sighash_type, utxo.amount,
      witness_version);
  return sighash;
}